

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O3

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::remove
          (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,char *__filename)

{
  Node ****ppppNVar1;
  uint uVar2;
  IntermediateNode *pIVar3;
  uint64_t uVar4;
  TermList *pTVar5;
  TermList *pTVar6;
  undefined8 uVar7;
  Node *pNVar8;
  Self SVar9;
  int iVar10;
  int extraout_EAX;
  Node ***pppNVar11;
  Entry *pEVar12;
  Node **inode;
  TermList **ppTVar13;
  ulong uVar14;
  undefined8 *in_RDX;
  TermList TVar15;
  ulong uVar16;
  Node *node;
  Top TVar17;
  Stack<Kernel::TermList_*> subterms;
  TermList t;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  history;
  Stack<Kernel::TermList_*> local_a0;
  TermList local_80;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_78;
  undefined8 *local_68;
  undefined8 local_60;
  undefined4 local_58;
  char local_54;
  ulong local_50;
  int iStack_48;
  undefined4 uStack_44;
  undefined1 uStack_40;
  undefined3 uStack_3f;
  undefined1 uStack_3c;
  undefined7 uStack_3b;
  undefined4 extraout_var;
  
  inode = &this->_root;
  local_68 = in_RDX;
  Lib::
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_78);
  while (iVar10 = (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[2])(),
        SVar9._M_t.
        super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
        .
        super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>,_true,_true>
                )local_78._self, (char)iVar10 == '\0') {
    pppNVar11 = *(Node ****)
                 ((long)local_78._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
                        ._M_head_impl + 0x10);
    if (pppNVar11 ==
        *(Node ****)
         ((long)local_78._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
                ._M_head_impl + 0x18)) {
      Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>
      ::expand((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>
                *)local_78._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
                  ._M_head_impl);
      pppNVar11 = *(Node ****)
                   ((long)SVar9._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
                          ._M_head_impl + 0x10);
    }
    *pppNVar11 = inode;
    ppppNVar1 = (Node ****)
                ((long)SVar9._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
                       ._M_head_impl + 0x10);
    *ppppNVar1 = *ppppNVar1 + 1;
    pIVar3 = (IntermediateNode *)*inode;
    local_a0._capacity = CONCAT44(local_a0._capacity._4_4_,pIVar3->childVar);
    pEVar12 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
              findEntry((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                         *)__filename,(uint *)&local_a0);
    local_80._content = (pEVar12->_val)._content;
    TVar17 = Kernel::TermList::top(&local_80);
    iVar10 = (*(pIVar3->super_Node)._vptr_Node[10])
                       (pIVar3,TVar17._inner._inner._0_8_,(ulong)(TVar17._inner._inner._8_4_ & 0xff)
                        ,0);
    inode = (Node **)CONCAT44(extraout_var,iVar10);
    uVar4 = (((IntermediateNode *)*inode)->super_Node)._term._content;
    if (uVar4 != local_80._content) {
      uVar2 = *(uint *)(uVar4 + 0xc);
      local_a0._capacity = 0x78;
      local_a0._stack = (TermList **)::operator_new(0x3c0,0x10);
      local_a0._end = local_a0._stack + local_a0._capacity;
      local_a0._cursor = local_a0._stack;
      if (local_a0._capacity == 0) {
        Lib::Stack<Kernel::TermList_*>::expand(&local_a0);
      }
      TVar15._content = local_80._content;
      *local_a0._cursor = (TermList *)(uVar4 + (ulong)(uVar2 & 0xfffffff) * 8 + 0x28);
      local_a0._cursor = local_a0._cursor + 1;
      uVar2 = *(uint *)(local_80._content + 0xc);
      if (local_a0._cursor == local_a0._end) {
        Lib::Stack<Kernel::TermList_*>::expand(&local_a0);
      }
      *local_a0._cursor = (TermList *)(TVar15._content + (ulong)(uVar2 & 0xfffffff) * 8 + 0x28);
      local_a0._cursor = local_a0._cursor + 1;
      while (local_a0._cursor != local_a0._stack) {
        pTVar5 = local_a0._cursor[-1];
        ppTVar13 = local_a0._cursor + -2;
        pTVar6 = local_a0._cursor[-2];
        if ((pTVar5[-1]._content & 3) != 2) {
          local_a0._cursor = ppTVar13;
          if (ppTVar13 == local_a0._end) {
            Lib::Stack<Kernel::TermList_*>::expand(&local_a0);
          }
          *local_a0._cursor = pTVar6 + -1;
          local_a0._cursor = local_a0._cursor + 1;
          if (local_a0._cursor == local_a0._end) {
            Lib::Stack<Kernel::TermList_*>::expand(&local_a0);
          }
          *local_a0._cursor = pTVar5 + -1;
          ppTVar13 = local_a0._cursor + 1;
        }
        uVar14 = pTVar6->_content;
        TVar15._content = pTVar5->_content;
        local_a0._cursor = ppTVar13;
        if (uVar14 != TVar15._content) {
          if ((uVar14 & 1) == 0) {
            uVar16 = (ulong)(*(uint *)(uVar14 + 0xc) & 0xfffffff);
            if ((*(uint *)(uVar14 + 0x28 + uVar16 * 8) & 3) != 2) {
              if (ppTVar13 == local_a0._end) {
                Lib::Stack<Kernel::TermList_*>::expand(&local_a0);
                TVar15._content = pTVar5->_content;
              }
              *local_a0._cursor = (TermList *)(uVar14 + uVar16 * 8 + 0x28);
              local_a0._cursor = local_a0._cursor + 1;
              uVar2 = *(uint *)(TVar15._content + 0xc);
              if (local_a0._cursor == local_a0._end) {
                Lib::Stack<Kernel::TermList_*>::expand(&local_a0);
              }
              *local_a0._cursor =
                   (TermList *)((ulong)(uVar2 & 0xfffffff) * 8 + 0x28 + TVar15._content);
              local_a0._cursor = local_a0._cursor + 1;
            }
          }
          else {
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                      ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *
                       )__filename,(uint)(uVar14 >> 2),TVar15);
          }
        }
      }
      if (local_a0._stack != (TermList **)0x0) {
        uVar14 = local_a0._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar14 == 0) {
          *local_a0._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_a0._stack;
        }
        else if (uVar14 < 0x11) {
          *local_a0._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_a0._stack;
        }
        else if (uVar14 < 0x19) {
          *local_a0._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_a0._stack;
        }
        else if (uVar14 < 0x21) {
          *local_a0._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_a0._stack;
        }
        else if (uVar14 < 0x31) {
          *local_a0._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_a0._stack;
        }
        else if (uVar14 < 0x41) {
          *local_a0._stack = (TermList *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_a0._stack;
        }
        else {
          operator_delete(local_a0._stack,0x10);
        }
      }
    }
  }
  local_58 = *(undefined4 *)(local_68 + 1);
  local_60 = *local_68;
  local_54 = *(char *)((long)local_68 + 0xc);
  if (local_54 == '\x01') {
    uStack_3b = 0;
    uVar7 = *(undefined8 *)((long)local_68 + 0x19);
    local_50 = (ulong)(*(uint5 *)(local_68 + 2) & 0xffffffff03);
    iStack_48._1_3_ = (uint3)uVar7;
    iStack_48 = (uint)iStack_48._1_3_ << 8;
    uStack_44 = (undefined4)((ulong)uVar7 >> 0x18);
    uStack_40 = (undefined1)((ulong)uVar7 >> 0x38);
    uStack_3f = (undefined3)*(undefined4 *)((long)local_68 + 0x21);
    uStack_3c = (undefined1)((uint)*(undefined4 *)((long)local_68 + 0x21) >> 0x18);
  }
  (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[10])((IntermediateNode *)*inode,&local_60)
  ;
  ensureLeafEfficiency((Leaf **)inode);
  do {
    iVar10 = (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[3])();
    if ((char)iVar10 == '\0') {
LAB_0035bd11:
      Lib::
      Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_78);
      return extraout_EAX;
    }
    pIVar3 = (IntermediateNode *)*inode;
    local_a0._capacity = (pIVar3->super_Node)._term._content;
    if (*(Node ****)
         ((long)local_78._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
                ._M_head_impl + 0x10) ==
        *(Node ****)
         ((long)local_78._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
                ._M_head_impl + 8)) {
      (*(pIVar3->super_Node)._vptr_Node[1])(pIVar3);
      *inode = (Node *)0x0;
      goto LAB_0035bd11;
    }
    pNVar8 = *(*(Node ****)
                ((long)local_78._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
                       ._M_head_impl + 0x10))[-1];
    TVar17 = Kernel::TermList::top((TermList *)&local_a0);
    (*pNVar8->_vptr_Node[0xb])
              (pNVar8,TVar17._inner._inner._0_8_,(ulong)(TVar17._inner._inner._8_4_ & 0xff));
    (*(pIVar3->super_Node)._vptr_Node[1])(pIVar3);
    pppNVar11 = *(Node ****)
                 ((long)local_78._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
                        .
                        super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
                        ._M_head_impl + 0x10);
    *(Node ****)
     ((long)local_78._self._M_t.
            super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_>_>
            .
            super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::Node_**>_*,_false>
            ._M_head_impl + 0x10) = pppNVar11 + -1;
    inode = pppNVar11[-1];
    ensureIntermediateNodeEfficiency((IntermediateNode **)inode);
  } while( true );
}

Assistant:

void SubstitutionTree<LeafData_>::remove(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_REMOVE(0, "remove: ", svBindings, " from ", *this)

  ASS(*pnode);

  Recycled<Stack<Node**>> history;

  while (! (*pnode)->isLeaf()) {
    history->push(pnode);

    IntermediateNode* inode=static_cast<IntermediateNode*>(*pnode);

    unsigned boundVar=inode->childVar;
    TermList t = svBindings.get(boundVar);

    pnode=inode->childByTop(t.top(),false);
    ASS(pnode);


    TermList* s = &(*pnode)->term();
    ASS(TermList::sameTop(*s,t));

    if(*s==t) {
      continue;
    }

    ASS(! s->isVar());
    TermList* ss = s->term()->args();
    ASS(!ss->isEmpty());

    // computing the disagreement set of the two terms
    Stack<TermList*> subterms(120);

    subterms.push(ss);
    subterms.push(t.term()->args());
    while (! subterms.isEmpty()) {
      TermList* tt = subterms.pop();
      ss = subterms.pop();
      if (tt->next()->isEmpty()) {
	ASS(ss->next()->isEmpty());
      }
      else {
	subterms.push(ss->next());
	subterms.push(tt->next());
      }
      if (*ss==*tt) {
	continue;
      }
      if (ss->isVar()) {
	ASS(ss->isSpecialVar());
	svBindings.set(ss->var(),*tt);
	continue;
      }
      ASS(! tt->isVar());
      ASS(ss->term()->functor() == tt->term()->functor());
      ss = ss->term()->args();
      if (! ss->isEmpty()) {
	ASS(! tt->term()->args()->isEmpty());
	subterms.push(ss);
	subterms.push(tt->term()->args());
      }
    }
  }

  ASS ((*pnode)->isLeaf());


  Leaf* lnode = static_cast<Leaf*>(*pnode);
  lnode->remove(ld);
  ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));

  while( (*pnode)->isEmpty() ) {
    TermList term=(*pnode)->term();
    if(history->isEmpty()) {
      delete *pnode;
      *pnode=0;
      DEBUG_REMOVE(0, "out: ", *this);
      return;
    } else {
      Node* node=*pnode;
      IntermediateNode* parent=static_cast<IntermediateNode*>(*history->top());
      parent->remove(term.top());
      delete node;
      pnode = history->pop();
      ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pnode));
    }
  }
  DEBUG_REMOVE(0, "out: ", *this);
}